

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

void nn(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *args)

{
  pointer pbVar1;
  int32_t k;
  long lVar2;
  istream *piVar3;
  string prompt;
  string queryWord;
  vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_f0;
  FastText fasttext;
  
  pbVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar2 = (long)(args->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if (lVar2 == 3) {
    k = 10;
  }
  else {
    if (lVar2 != 4) {
      printNNUsage();
      exit(1);
    }
    k = std::__cxx11::stoi(pbVar1 + 3,(size_t *)0x0,10);
  }
  ::fasttext::FastText::FastText(&fasttext);
  std::__cxx11::string::string
            ((string *)&prompt,
             (string *)
             ((args->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start + 2));
  ::fasttext::FastText::loadModel(&fasttext,&prompt);
  std::__cxx11::string::~string((string *)&prompt);
  std::__cxx11::string::string((string *)&prompt,"Query word? ",(allocator *)&queryWord);
  std::operator<<((ostream *)&std::cout,(string *)&prompt);
  queryWord._M_dataplus._M_p = (pointer)&queryWord.field_2;
  queryWord._M_string_length = 0;
  queryWord.field_2._M_local_buf[0] = '\0';
  while( true ) {
    piVar3 = std::operator>>((istream *)&std::cin,(string *)&queryWord);
    if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
    ::fasttext::FastText::getNN(&local_f0,&fasttext,&queryWord,k);
    printPredictions(&local_f0,true,true);
    std::
    vector<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<float,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_f0);
    std::operator<<((ostream *)&std::cout,(string *)&prompt);
  }
  exit(0);
}

Assistant:

void nn(const std::vector<std::string> args) {
  int32_t k;
  if (args.size() == 3) {
    k = 10;
  } else if (args.size() == 4) {
    k = std::stoi(args[3]);
  } else {
    printNNUsage();
    exit(EXIT_FAILURE);
  }
  FastText fasttext;
  fasttext.loadModel(std::string(args[2]));
  std::string prompt("Query word? ");
  std::cout << prompt;

  std::string queryWord;
  while (std::cin >> queryWord) {
    printPredictions(fasttext.getNN(queryWord, k), true, true);
    std::cout << prompt;
  }
  exit(0);
}